

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *
testinator::Arbitrary<std::pair<int,_float>_>::shrink
          (vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
           *__return_storage_ptr__,pair<int,_float> *p)

{
  vector<float,_std::allocator<float>_> second_v;
  vector<int,_std::allocator<int>_> first_v;
  _Vector_base<float,_std::allocator<float>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::pair<T1, T2>> shrink(const std::pair<T1, T2>& p)
    {
      std::vector<std::pair<T1, T2>> ret{};

      // shrink the first
      auto first_v = Arbitrary<std::decay_t<T1>>::shrink(p.first);
      for (auto& e : first_v)
      {
        ret.emplace_back(std::move(e), p.second);
      }

      // shrink the second
      auto second_v = Arbitrary<std::decay_t<T2>>::shrink(p.second);
      for (auto& e : second_v)
      {
        ret.emplace_back(p.first, std::move(e));
      }

      return ret;
    }